

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O0

void __thiscall
ResourcesDictionary::AddImageXObjectMapping
          (ResourcesDictionary *this,PDFImageXObject *inImageXObject,string *inImageXObjectName)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  _Self local_38;
  ObjectIDType local_30;
  _Self local_28;
  iterator it;
  string *inImageXObjectName_local;
  PDFImageXObject *inImageXObject_local;
  ResourcesDictionary *this_local;
  
  it._M_node = (_Base_ptr)inImageXObjectName;
  local_30 = PDFImageXObject::GetImageObjectID(inImageXObject);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->mXObjects,&local_30);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->mXObjects);
  bVar2 = std::operator==(&local_28,&local_38);
  iVar1 = it;
  if (bVar2) {
    AddImageXObjectMappingWithName(this,inImageXObject,(string *)it._M_node);
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::operator=((string *)&ppVar3->second,(string *)iVar1._M_node);
  }
  return;
}

Assistant:

void ResourcesDictionary::AddImageXObjectMapping(PDFImageXObject* inImageXObject, const std::string& inImageXObjectName)
{
	ObjectIDTypeToStringMap::iterator it = mXObjects.find(inImageXObject->GetImageObjectID());

	if(it == mXObjects.end())
		AddImageXObjectMappingWithName(inImageXObject,inImageXObjectName);
	else
		it->second = inImageXObjectName;
}